

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqlresult.cpp
# Opt level: O3

QVariant * __thiscall
QSqlResult::boundValue(QVariant *__return_storage_ptr__,QSqlResult *this,QString *placeholder)

{
  QSqlResultPrivate *pQVar1;
  ulong uVar2;
  anon_union_24_3_e3d07ef4_for_data *paVar3;
  long in_FS_OFFSET;
  QList<int> local_68;
  anon_union_24_3_e3d07ef4_for_data local_48;
  undefined8 local_30;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = this->d_ptr;
  local_68.d.size = -0x5555555555555556;
  local_68.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_68.d.ptr = (int *)0xaaaaaaaaaaaaaaaa;
  QHash<QString,_QList<int>_>::value(&local_68,&pQVar1->indexes,placeholder);
  if (local_68.d.size == 0) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = (ulong)*local_68.d.ptr;
  }
  local_48.shared = (PrivateShared *)0x0;
  local_48._8_8_ = 0;
  local_48._16_8_ = 0;
  local_30 = 2;
  paVar3 = (anon_union_24_3_e3d07ef4_for_data *)((pQVar1->values).d.ptr + uVar2);
  if ((ulong)(pQVar1->values).d.size <= uVar2) {
    paVar3 = &local_48;
  }
  QVariant::QVariant(__return_storage_ptr__,(QVariant *)paVar3);
  QVariant::~QVariant((QVariant *)&local_48);
  if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QVariant QSqlResult::boundValue(const QString& placeholder) const
{
    Q_D(const QSqlResult);
    const QList<int> indexes = d->indexes.value(placeholder);
    return d->values.value(indexes.value(0,-1));
}